

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3BeginTransaction(Parse *pParse,int type)

{
  sqlite3 *psVar1;
  int iVar2;
  uint uVar3;
  Vdbe *p;
  long lVar4;
  long lVar5;
  
  psVar1 = pParse->db;
  iVar2 = sqlite3AuthCheck(pParse,0x16,"BEGIN",(char *)0x0,(char *)0x0);
  if (iVar2 == 0) {
    p = sqlite3GetVdbe(pParse);
    if (p != (Vdbe *)0x0) {
      if ((type != 7) && (0 < psVar1->nDb)) {
        lVar4 = 8;
        lVar5 = 0;
        do {
          sqlite3VdbeAddOp3(p,4,(int)lVar5,(type == 9) + 1,0);
          uVar3 = 1 << ((byte)lVar5 & 0x1f);
          p->btreeMask = p->btreeMask | uVar3;
          if ((lVar5 != 1) &&
             (*(char *)(*(long *)((long)&p->db->aDb->zName + lVar4) + 0x11) != '\0')) {
            p->lockMask = p->lockMask | uVar3;
          }
          lVar5 = lVar5 + 1;
          lVar4 = lVar4 + 0x20;
        } while (lVar5 < psVar1->nDb);
      }
      sqlite3VdbeAddOp3(p,3,0,0,0);
      return;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3BeginTransaction(Parse *pParse, int type){
  sqlite3 *db;
  Vdbe *v;
  int i;

  assert( pParse!=0 );
  db = pParse->db;
  assert( db!=0 );
/*  if( db->aDb[0].pBt==0 ) return; */
  if( sqlite3AuthCheck(pParse, SQLITE_TRANSACTION, "BEGIN", 0, 0) ){
    return;
  }
  v = sqlite3GetVdbe(pParse);
  if( !v ) return;
  if( type!=TK_DEFERRED ){
    for(i=0; i<db->nDb; i++){
      sqlite3VdbeAddOp2(v, OP_Transaction, i, (type==TK_EXCLUSIVE)+1);
      sqlite3VdbeUsesBtree(v, i);
    }
  }
  sqlite3VdbeAddOp2(v, OP_AutoCommit, 0, 0);
}